

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  float fVar2;
  float fVar3;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar4;
  BVH *bvh;
  size_t sVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  byte bVar18;
  int iVar19;
  byte bVar20;
  byte bVar21;
  uint uVar22;
  NodeRef root;
  size_t sVar23;
  long lVar24;
  RayK<4> *ray_00;
  NodeRef *pNVar25;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar26;
  undefined4 uVar27;
  byte bVar28;
  bool bVar29;
  ulong uVar30;
  byte bVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  vint4 ai_2;
  vint4 bi;
  vint4 bi_1;
  undefined1 in_ZMM2 [64];
  vint4 bi_3;
  undefined1 auVar48 [16];
  vint4 ai;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 bi_2;
  undefined1 auVar51 [16];
  vint4 ai_1;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  vint4 ai_3;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar75 [64];
  Precalculations pre;
  undefined1 local_3748 [16];
  RayK<4> *local_3738;
  ulong local_3730;
  int local_3728;
  int iStack_3724;
  int iStack_3720;
  int iStack_371c;
  RTCFilterFunctionNArguments args;
  undefined1 local_36e8 [16];
  undefined1 local_36d8 [16];
  undefined1 local_36c8 [16];
  undefined1 local_36b8 [16];
  undefined1 local_36a8 [16];
  undefined1 local_3698 [8];
  float fStack_3690;
  float fStack_368c;
  undefined1 local_3688 [8];
  float fStack_3680;
  float fStack_367c;
  TravRayK<4,_false> tray;
  undefined8 local_3568;
  undefined8 uStack_3560;
  undefined8 local_3558;
  undefined8 uStack_3550;
  undefined1 local_3548 [16];
  undefined1 local_3538 [16];
  float local_3528;
  float fStack_3524;
  float fStack_3520;
  float fStack_351c;
  undefined1 local_3518 [16];
  undefined1 local_3508 [16];
  uint local_34f8;
  uint uStack_34f4;
  uint uStack_34f0;
  uint uStack_34ec;
  uint uStack_34e8;
  uint uStack_34e4;
  uint uStack_34e0;
  uint uStack_34dc;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar34 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar39 = ZEXT816(0) << 0x40;
    uVar11 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar39,5);
    uVar32 = vpcmpeqd_avx512vl(auVar34,(undefined1  [16])valid_i->field_0);
    uVar32 = ((byte)uVar11 & 0xf) & uVar32;
    bVar31 = (byte)uVar32;
    if (bVar31 != 0) {
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar70 = ZEXT1664(auVar34);
      auVar35 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar34);
      auVar37._8_4_ = 0x219392ef;
      auVar37._0_8_ = 0x219392ef219392ef;
      auVar37._12_4_ = 0x219392ef;
      uVar33 = vcmpps_avx512vl(auVar35,auVar37,1);
      bVar29 = (bool)((byte)uVar33 & 1);
      auVar35._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * tray.dir.field_0._0_4_;
      bVar29 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar35._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * tray.dir.field_0._4_4_;
      bVar29 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar35._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * tray.dir.field_0._8_4_;
      bVar29 = (bool)((byte)(uVar33 >> 3) & 1);
      auVar35._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * tray.dir.field_0._12_4_;
      auVar36 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar34);
      uVar33 = vcmpps_avx512vl(auVar36,auVar37,1);
      bVar29 = (bool)((byte)uVar33 & 1);
      auVar36._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * tray.dir.field_0._16_4_;
      bVar29 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar36._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * tray.dir.field_0._20_4_;
      bVar29 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar36._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * tray.dir.field_0._24_4_;
      bVar29 = (bool)((byte)(uVar33 >> 3) & 1);
      auVar36._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * tray.dir.field_0._28_4_;
      auVar34 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar34);
      uVar33 = vcmpps_avx512vl(auVar34,auVar37,1);
      bVar29 = (bool)((byte)uVar33 & 1);
      auVar34._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * tray.dir.field_0._32_4_;
      bVar29 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar34._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * tray.dir.field_0._36_4_;
      bVar29 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar34._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * tray.dir.field_0._40_4_;
      bVar29 = (bool)((byte)(uVar33 >> 3) & 1);
      auVar34._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * tray.dir.field_0._44_4_;
      auVar37 = vrcp14ps_avx512vl(auVar35);
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar71 = ZEXT1664(auVar38);
      auVar35 = vfnmadd213ps_avx512vl(auVar35,auVar37,auVar38);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar35,auVar37,auVar37)
      ;
      auVar35 = vrcp14ps_avx512vl(auVar36);
      auVar36 = vfnmadd213ps_avx512vl(auVar36,auVar35,auVar38);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar36,auVar35,auVar35)
      ;
      auVar35 = vrcp14ps_avx512vl(auVar34);
      auVar34 = vfnmadd213ps_avx512vl(auVar34,auVar35,auVar38);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar34,auVar35,auVar35)
      ;
      uVar33 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar39,1);
      auVar34 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar33 >> 1) & 1) * auVar34._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar33 & 1) * auVar34._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar33 >> 2) & 1) * auVar34._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar33 >> 3) & 1) * auVar34._12_4_;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      uVar33 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar39,5);
      auVar34 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar29 = (bool)((byte)uVar33 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar29 * auVar34._0_4_ | (uint)!bVar29 * 0x60;
      bVar29 = (bool)((byte)(uVar33 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar29 * auVar34._4_4_ | (uint)!bVar29 * 0x60;
      bVar29 = (bool)((byte)(uVar33 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar29 * auVar34._8_4_ | (uint)!bVar29 * 0x60;
      bVar29 = (bool)((byte)(uVar33 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar29 * auVar34._12_4_ | (uint)!bVar29 * 0x60;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      uVar33 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar39,5);
      auVar34 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar29 = (bool)((byte)uVar33 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar29 * auVar34._0_4_ | (uint)!bVar29 * 0xa0;
      bVar29 = (bool)((byte)(uVar33 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar29 * auVar34._4_4_ | (uint)!bVar29 * 0xa0;
      bVar29 = (bool)((byte)(uVar33 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar29 * auVar34._8_4_ | (uint)!bVar29 * 0xa0;
      bVar29 = (bool)((byte)(uVar33 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar29 * auVar34._12_4_ | (uint)!bVar29 * 0xa0;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar73 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar34 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar39);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar31 & 1) * auVar34._0_4_ |
           (uint)!(bool)(bVar31 & 1) * stack_near[0].field_0._0_4_;
      bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar29 * auVar34._4_4_ | (uint)!bVar29 * stack_near[0].field_0._4_4_;
      bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar29 * auVar34._8_4_ | (uint)!bVar29 * stack_near[0].field_0._8_4_;
      bVar29 = SUB81(uVar32 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar29 * auVar34._12_4_ | (uint)!bVar29 * stack_near[0].field_0._12_4_;
      auVar34 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar72 = ZEXT1664(auVar34);
      auVar39 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar39);
      tray.tfar.field_0.i[0] =
           (uint)(bVar31 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar31 & 1) * auVar34._0_4_;
      bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar29 * auVar39._4_4_ | (uint)!bVar29 * auVar34._4_4_;
      bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar29 * auVar39._8_4_ | (uint)!bVar29 * auVar34._8_4_;
      bVar29 = SUB81(uVar32 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar29 * auVar39._12_4_ | (uint)!bVar29 * auVar34._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar22 = 3;
      }
      else {
        uVar22 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      bVar28 = (byte)((ushort)((short)uVar32 << 0xc) >> 0xc) ^ 0xf;
      pNVar25 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar26 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      stack_node[1].ptr = (bvh->root).ptr;
      auVar34 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar74 = ZEXT1664(auVar34);
      auVar34 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
      auVar75 = ZEXT1664(auVar34);
      ray_00 = ray;
LAB_0080f9ae:
      paVar26 = paVar26 + -1;
      root.ptr = pNVar25[-1].ptr;
      pNVar25 = pNVar25 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_00810120;
      aVar4 = *paVar26;
      uVar32 = vcmpps_avx512vl((undefined1  [16])aVar4,(undefined1  [16])tray.tfar.field_0,1);
      if ((char)uVar32 == '\0') {
LAB_00810156:
        iVar19 = 2;
      }
      else {
        uVar27 = (undefined4)uVar32;
        iVar19 = 0;
        if ((uint)POPCOUNT(uVar27) <= uVar22) {
          do {
            sVar23 = 0;
            for (uVar33 = uVar32; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
              sVar23 = sVar23 + 1;
            }
            bVar29 = occluded1(This,bvh,root,sVar23,&pre,ray_00,&tray,context);
            bVar18 = (byte)(1 << ((uint)sVar23 & 0x1f));
            if (!bVar29) {
              bVar18 = 0;
            }
            bVar28 = bVar28 | bVar18;
            uVar32 = uVar32 - 1 & uVar32;
          } while (uVar32 != 0);
          if (bVar28 == 0xf) {
            iVar19 = 3;
          }
          else {
            auVar34 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)(bVar28 & 1) * auVar34._0_4_ |
                 (uint)!(bool)(bVar28 & 1) * tray.tfar.field_0.i[0];
            bVar29 = (bool)(bVar28 >> 1 & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar29 * auVar34._4_4_ | (uint)!bVar29 * tray.tfar.field_0.i[1];
            bVar29 = (bool)(bVar28 >> 2 & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar29 * auVar34._8_4_ | (uint)!bVar29 * tray.tfar.field_0.i[2];
            bVar29 = (bool)(bVar28 >> 3 & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar29 * auVar34._12_4_ | (uint)!bVar29 * tray.tfar.field_0.i[3];
            iVar19 = 2;
          }
          auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar70 = ZEXT1664(auVar34);
          auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar71 = ZEXT1664(auVar34);
          auVar34 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
          auVar72 = ZEXT1664(auVar34);
          auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar73 = ZEXT1664(auVar34);
          auVar34 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar74 = ZEXT1664(auVar34);
          auVar34 = vxorps_avx512vl(auVar75._0_16_,auVar75._0_16_);
          auVar75 = ZEXT1664(auVar34);
        }
        auVar60 = ZEXT1664((undefined1  [16])aVar4);
        if (uVar22 < (uint)POPCOUNT(uVar27)) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00810120;
              uVar11 = vcmpps_avx512vl(auVar60._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar11 == '\0') goto LAB_00810156;
              bVar18 = bVar28 & 0xf;
              local_3730 = (ulong)((uint)root.ptr & 0xf) - 8;
              if (local_3730 == 0) goto LAB_00810117;
              bVar18 = bVar18 ^ 0xf;
              lVar24 = (root.ptr & 0xfffffffffffffff0) + 0xa0;
              uVar32 = 0;
              goto LAB_0080fbd2;
            }
            auVar60 = ZEXT1664(auVar73._0_16_);
            uVar32 = 0;
            sVar23 = 8;
            do {
              sVar5 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + uVar32 * 8);
              if (sVar5 != 8) {
                auVar16._4_4_ = tray.org_rdir.field_0._4_4_;
                auVar16._0_4_ = tray.org_rdir.field_0._0_4_;
                auVar16._8_4_ = tray.org_rdir.field_0._8_4_;
                auVar16._12_4_ = tray.org_rdir.field_0._12_4_;
                uVar27 = *(undefined4 *)(root.ptr + 0x40 + uVar32 * 4);
                auVar49._4_4_ = uVar27;
                auVar49._0_4_ = uVar27;
                auVar49._8_4_ = uVar27;
                auVar49._12_4_ = uVar27;
                auVar35 = vfmsub132ps_fma(auVar49,auVar16,
                                          (undefined1  [16])tray.rdir.field_0.field_0.x.field_0);
                uVar27 = *(undefined4 *)(root.ptr + 0x80 + uVar32 * 4);
                auVar52._4_4_ = uVar27;
                auVar52._0_4_ = uVar27;
                auVar52._8_4_ = uVar27;
                auVar52._12_4_ = uVar27;
                auVar17._4_4_ = tray.org_rdir.field_0._36_4_;
                auVar17._0_4_ = tray.org_rdir.field_0._32_4_;
                auVar17._8_4_ = tray.org_rdir.field_0._40_4_;
                auVar17._12_4_ = tray.org_rdir.field_0._44_4_;
                uVar27 = *(undefined4 *)(root.ptr + 0xc0 + uVar32 * 4);
                auVar56._4_4_ = uVar27;
                auVar56._0_4_ = uVar27;
                auVar56._8_4_ = uVar27;
                auVar56._12_4_ = uVar27;
                auVar36 = vfmsub132ps_fma(auVar52,(undefined1  [16])
                                                  tray.org_rdir.field_0.field_0.y.field_0,
                                          (undefined1  [16])tray.rdir.field_0.field_0.y.field_0);
                auVar37 = vfmsub132ps_fma(auVar56,auVar17,
                                          (undefined1  [16])tray.rdir.field_0.field_0.z.field_0);
                uVar27 = *(undefined4 *)(root.ptr + 0x60 + uVar32 * 4);
                auVar13._4_4_ = uVar27;
                auVar13._0_4_ = uVar27;
                auVar13._8_4_ = uVar27;
                auVar13._12_4_ = uVar27;
                auVar38 = vfmsub132ps_avx512vl
                                    ((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar16,
                                     auVar13);
                uVar27 = *(undefined4 *)(root.ptr + 0xa0 + uVar32 * 4);
                auVar14._4_4_ = uVar27;
                auVar14._0_4_ = uVar27;
                auVar14._8_4_ = uVar27;
                auVar14._12_4_ = uVar27;
                auVar40 = vfmsub132ps_avx512vl
                                    ((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,
                                     (undefined1  [16])tray.org_rdir.field_0.field_0.y.field_0,
                                     auVar14);
                uVar27 = *(undefined4 *)(root.ptr + 0xe0 + uVar32 * 4);
                auVar15._4_4_ = uVar27;
                auVar15._0_4_ = uVar27;
                auVar15._8_4_ = uVar27;
                auVar15._12_4_ = uVar27;
                auVar41 = vfmsub132ps_avx512vl
                                    ((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar17,
                                     auVar15);
                auVar34 = vpminsd_avx(auVar35,auVar38);
                auVar39 = vpminsd_avx(auVar36,auVar40);
                auVar34 = vpmaxsd_avx(auVar34,auVar39);
                auVar39 = vpminsd_avx(auVar37,auVar41);
                auVar34 = vpmaxsd_avx(auVar34,auVar39);
                auVar39 = vpmaxsd_avx(auVar35,auVar38);
                auVar35 = vpmaxsd_avx(auVar36,auVar40);
                auVar35 = vpminsd_avx(auVar39,auVar35);
                auVar39 = vpmaxsd_avx(auVar37,auVar41);
                auVar35 = vpminsd_avx(auVar35,auVar39);
                auVar39 = vpmaxsd_avx(auVar34,(undefined1  [16])tray.tnear.field_0);
                auVar35 = vpminsd_avx(auVar35,(undefined1  [16])tray.tfar.field_0);
                uVar33 = vpcmpd_avx512vl(auVar39,auVar35,2);
                uVar33 = uVar33 & 0xf;
                if ((byte)uVar33 != 0) {
                  auVar39 = vblendmps_avx512vl(auVar73._0_16_,auVar34);
                  bVar29 = (bool)((byte)uVar33 & 1);
                  bVar8 = (bool)((byte)(uVar33 >> 1) & 1);
                  bVar9 = (bool)((byte)(uVar33 >> 2) & 1);
                  bVar10 = SUB81(uVar33 >> 3,0);
                  if (sVar23 != 8) {
                    pNVar25->ptr = sVar23;
                    pNVar25 = pNVar25 + 1;
                    *paVar26 = auVar60._0_16_;
                    paVar26 = paVar26 + 1;
                  }
                  auVar60 = ZEXT1664(CONCAT412((uint)bVar10 * auVar39._12_4_ |
                                               (uint)!bVar10 * auVar34._12_4_,
                                               CONCAT48((uint)bVar9 * auVar39._8_4_ |
                                                        (uint)!bVar9 * auVar34._8_4_,
                                                        CONCAT44((uint)bVar8 * auVar39._4_4_ |
                                                                 (uint)!bVar8 * auVar34._4_4_,
                                                                 (uint)bVar29 * auVar39._0_4_ |
                                                                 (uint)!bVar29 * auVar34._0_4_))));
                  sVar23 = sVar5;
                }
              }
            } while ((sVar5 != 8) && (bVar29 = uVar32 < 7, uVar32 = uVar32 + 1, bVar29));
            iVar19 = 0;
            if (sVar23 == 8) {
LAB_0080fb81:
              bVar29 = false;
              iVar19 = 4;
            }
            else {
              uVar11 = vcmpps_avx512vl((undefined1  [16])auVar60._0_16_,
                                       (undefined1  [16])tray.tfar.field_0,9);
              bVar29 = true;
              if ((uint)POPCOUNT((int)uVar11) <= uVar22) {
                pNVar25->ptr = sVar23;
                pNVar25 = pNVar25 + 1;
                *paVar26 = auVar60._0_16_;
                paVar26 = paVar26 + 1;
                goto LAB_0080fb81;
              }
            }
            root.ptr = sVar23;
          } while (bVar29);
        }
      }
      goto LAB_00810148;
    }
  }
  return;
  while( true ) {
    uVar32 = uVar32 + 1;
    lVar24 = lVar24 + 0xb0;
    if (local_3730 <= uVar32) break;
LAB_0080fbd2:
    uVar33 = 0;
    bVar21 = bVar18;
    while (uVar30 = (ulong)*(uint *)(lVar24 + -0x10 + uVar33 * 4), uVar30 != 0xffffffff) {
      uVar27 = *(undefined4 *)(lVar24 + -0xa0 + uVar33 * 4);
      auVar41._4_4_ = uVar27;
      auVar41._0_4_ = uVar27;
      auVar41._8_4_ = uVar27;
      auVar41._12_4_ = uVar27;
      uVar27 = *(undefined4 *)(lVar24 + -0x90 + uVar33 * 4);
      auVar50._4_4_ = uVar27;
      auVar50._0_4_ = uVar27;
      auVar50._8_4_ = uVar27;
      auVar50._12_4_ = uVar27;
      uVar27 = *(undefined4 *)(lVar24 + -0x80 + uVar33 * 4);
      auVar53._4_4_ = uVar27;
      auVar53._0_4_ = uVar27;
      auVar53._8_4_ = uVar27;
      auVar53._12_4_ = uVar27;
      uVar27 = *(undefined4 *)(lVar24 + -0x70 + uVar33 * 4);
      auVar55._4_4_ = uVar27;
      auVar55._0_4_ = uVar27;
      auVar55._8_4_ = uVar27;
      auVar55._12_4_ = uVar27;
      uVar27 = *(undefined4 *)(lVar24 + -0x60 + uVar33 * 4);
      auVar59._4_4_ = uVar27;
      auVar59._0_4_ = uVar27;
      auVar59._8_4_ = uVar27;
      auVar59._12_4_ = uVar27;
      fVar2 = *(float *)(lVar24 + -0x50 + uVar33 * 4);
      auVar44._4_4_ = fVar2;
      auVar44._0_4_ = fVar2;
      auVar44._8_4_ = fVar2;
      auVar44._12_4_ = fVar2;
      fVar3 = *(float *)(lVar24 + -0x40 + uVar33 * 4);
      auVar69._4_4_ = fVar3;
      auVar69._0_4_ = fVar3;
      auVar69._8_4_ = fVar3;
      auVar69._12_4_ = fVar3;
      auVar42 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar24 + -0x30 + uVar33 * 4)));
      auVar43 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar24 + -0x20 + uVar33 * 4)));
      auVar34 = vmulss_avx512f(auVar59,auVar43);
      auVar39._0_4_ = auVar34._0_4_;
      auVar39._4_4_ = auVar39._0_4_;
      auVar39._8_4_ = auVar39._0_4_;
      auVar39._12_4_ = auVar39._0_4_;
      auVar44 = vfmsub231ps_avx512vl(auVar39,auVar42,auVar44);
      fVar3 = fVar2 * fVar3;
      auVar38._4_4_ = fVar3;
      auVar38._0_4_ = fVar3;
      auVar38._8_4_ = fVar3;
      auVar38._12_4_ = fVar3;
      auVar45 = vfmsub231ps_avx512vl(auVar38,auVar43,auVar55);
      auVar34 = vmulss_avx512f(auVar55,auVar42);
      auVar40._0_4_ = auVar34._0_4_;
      auVar40._4_4_ = auVar40._0_4_;
      auVar40._8_4_ = auVar40._0_4_;
      auVar40._12_4_ = auVar40._0_4_;
      auVar40 = vfmsub231ps_fma(auVar40,auVar69,auVar59);
      auVar36 = vsubps_avx(auVar41,*(undefined1 (*) [16])ray_00);
      auVar37 = vsubps_avx(auVar50,*(undefined1 (*) [16])(ray_00 + 0x10));
      auVar38 = vsubps_avx(auVar53,*(undefined1 (*) [16])(ray_00 + 0x20));
      auVar34 = *(undefined1 (*) [16])(ray_00 + 0x40);
      auVar39 = *(undefined1 (*) [16])(ray_00 + 0x50);
      auVar35 = *(undefined1 (*) [16])(ray_00 + 0x60);
      auVar66._0_4_ = auVar39._0_4_ * auVar38._0_4_;
      auVar66._4_4_ = auVar39._4_4_ * auVar38._4_4_;
      auVar66._8_4_ = auVar39._8_4_ * auVar38._8_4_;
      auVar66._12_4_ = auVar39._12_4_ * auVar38._12_4_;
      auVar41 = vfmsub231ps_fma(auVar66,auVar37,auVar35);
      auVar67._0_4_ = auVar35._0_4_ * auVar36._0_4_;
      auVar67._4_4_ = auVar35._4_4_ * auVar36._4_4_;
      auVar67._8_4_ = auVar35._8_4_ * auVar36._8_4_;
      auVar67._12_4_ = auVar35._12_4_ * auVar36._12_4_;
      auVar50 = vfmsub231ps_fma(auVar67,auVar38,auVar34);
      auVar68._0_4_ = auVar34._0_4_ * auVar37._0_4_;
      auVar68._4_4_ = auVar34._4_4_ * auVar37._4_4_;
      auVar68._8_4_ = auVar34._8_4_ * auVar37._8_4_;
      auVar68._12_4_ = auVar34._12_4_ * auVar37._12_4_;
      auVar53 = vfmsub231ps_fma(auVar68,auVar36,auVar39);
      auVar54._0_4_ = auVar40._0_4_ * auVar35._0_4_;
      auVar54._4_4_ = auVar40._4_4_ * auVar35._4_4_;
      auVar54._8_4_ = auVar40._8_4_ * auVar35._8_4_;
      auVar54._12_4_ = auVar40._12_4_ * auVar35._12_4_;
      auVar39 = vfmadd231ps_fma(auVar54,auVar45,auVar39);
      auVar34 = vfmadd231ps_fma(auVar39,auVar44,auVar34);
      auVar35 = vandps_avx512vl(auVar34,auVar74._0_16_);
      auVar39 = vmulps_avx512vl(auVar43,auVar53);
      auVar39 = vfmadd231ps_avx512vl(auVar39,auVar50,auVar42);
      auVar39 = vfmadd231ps_fma(auVar39,auVar41,auVar69);
      uVar62 = auVar35._0_4_;
      auVar42._0_4_ = uVar62 ^ auVar39._0_4_;
      uVar63 = auVar35._4_4_;
      auVar42._4_4_ = uVar63 ^ auVar39._4_4_;
      uVar64 = auVar35._8_4_;
      auVar42._8_4_ = uVar64 ^ auVar39._8_4_;
      uVar65 = auVar35._12_4_;
      auVar42._12_4_ = uVar65 ^ auVar39._12_4_;
      auVar39 = auVar75._0_16_;
      uVar11 = vcmpps_avx512vl(auVar42,auVar39,5);
      bVar20 = (byte)uVar11 & bVar21;
      if (bVar20 == 0) {
LAB_0080fce1:
        bVar20 = 0;
      }
      else {
        auVar61._0_4_ = fVar2 * auVar53._0_4_;
        auVar61._4_4_ = fVar2 * auVar53._4_4_;
        auVar61._8_4_ = fVar2 * auVar53._8_4_;
        auVar61._12_4_ = fVar2 * auVar53._12_4_;
        auVar35 = vfmadd213ps_fma(auVar50,auVar59,auVar61);
        auVar35 = vfmadd213ps_fma(auVar41,auVar55,auVar35);
        auVar43._0_4_ = uVar62 ^ auVar35._0_4_;
        auVar43._4_4_ = uVar63 ^ auVar35._4_4_;
        auVar43._8_4_ = uVar64 ^ auVar35._8_4_;
        auVar43._12_4_ = uVar65 ^ auVar35._12_4_;
        uVar11 = vcmpps_avx512vl(auVar43,auVar39,5);
        bVar20 = bVar20 & (byte)uVar11;
        if (bVar20 == 0) goto LAB_0080fce1;
        auVar41 = vandps_avx512vl(auVar34,auVar70._0_16_);
        auVar35 = vsubps_avx(auVar41,auVar42);
        uVar11 = vcmpps_avx512vl(auVar35,auVar43,5);
        bVar20 = bVar20 & (byte)uVar11;
        if (bVar20 == 0) {
LAB_00810032:
          bVar20 = 0;
        }
        else {
          auVar57._0_4_ = auVar38._0_4_ * auVar40._0_4_;
          auVar57._4_4_ = auVar38._4_4_ * auVar40._4_4_;
          auVar57._8_4_ = auVar38._8_4_ * auVar40._8_4_;
          auVar57._12_4_ = auVar38._12_4_ * auVar40._12_4_;
          auVar35 = vfmadd213ps_fma(auVar37,auVar45,auVar57);
          auVar35 = vfmadd213ps_fma(auVar36,auVar44,auVar35);
          auVar51._0_4_ = auVar41._0_4_ * *(float *)(ray_00 + 0x30);
          auVar51._4_4_ = auVar41._4_4_ * *(float *)(ray_00 + 0x34);
          auVar51._8_4_ = auVar41._8_4_ * *(float *)(ray_00 + 0x38);
          auVar51._12_4_ = auVar41._12_4_ * *(float *)(ray_00 + 0x3c);
          auVar48._0_4_ = uVar62 ^ auVar35._0_4_;
          auVar48._4_4_ = uVar63 ^ auVar35._4_4_;
          auVar48._8_4_ = uVar64 ^ auVar35._8_4_;
          auVar48._12_4_ = uVar65 ^ auVar35._12_4_;
          auVar58._0_4_ = auVar41._0_4_ * *(float *)(ray_00 + 0x80);
          auVar58._4_4_ = auVar41._4_4_ * *(float *)(ray_00 + 0x84);
          auVar58._8_4_ = auVar41._8_4_ * *(float *)(ray_00 + 0x88);
          auVar58._12_4_ = auVar41._12_4_ * *(float *)(ray_00 + 0x8c);
          uVar11 = vcmpps_avx512vl(auVar48,auVar58,2);
          uVar12 = vcmpps_avx512vl(auVar51,auVar48,1);
          bVar20 = bVar20 & (byte)uVar11 & (byte)uVar12;
          if (bVar20 == 0) goto LAB_00810032;
          uVar11 = vcmpps_avx512vl(auVar34,ZEXT816(0) << 0x20,4);
          bVar20 = bVar20 & (byte)uVar11;
          if (bVar20 != 0) {
            local_36e8 = auVar40;
            local_36d8 = auVar45;
            local_36c8 = auVar44;
            local_36b8 = auVar41;
            local_36a8 = auVar48;
            _local_3698 = auVar43;
            _local_3688 = auVar42;
          }
        }
        auVar70 = ZEXT1664(auVar70._0_16_);
        auVar34 = vxorps_avx512vl(auVar39,auVar39);
        auVar75 = ZEXT1664(auVar34);
      }
      auVar34 = auVar75._0_16_;
      pGVar6 = (context->scene->geometries).items[uVar30].ptr;
      uVar62 = pGVar6->mask;
      auVar45._4_4_ = uVar62;
      auVar45._0_4_ = uVar62;
      auVar45._8_4_ = uVar62;
      auVar45._12_4_ = uVar62;
      uVar11 = vptestmd_avx512vl(auVar45,*(undefined1 (*) [16])(ray_00 + 0x90));
      bVar20 = (byte)uVar11 & 0xf & bVar20;
      uVar30 = (ulong)bVar20;
      if (bVar20 != 0) {
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar39 = vrcp14ps_avx512vl(local_36b8);
          auVar35 = vfnmadd213ps_avx512vl(auVar39,local_36b8,auVar71._0_16_);
          auVar39 = vfmadd132ps_fma(auVar35,auVar39,auVar39);
          local_3538._0_4_ = auVar39._0_4_ * (float)local_3688._0_4_;
          local_3538._4_4_ = auVar39._4_4_ * (float)local_3688._4_4_;
          local_3538._8_4_ = auVar39._8_4_ * fStack_3680;
          local_3538._12_4_ = auVar39._12_4_ * fStack_367c;
          local_3528 = auVar39._0_4_ * (float)local_3698._0_4_;
          fStack_3524 = auVar39._4_4_ * (float)local_3698._4_4_;
          fStack_3520 = auVar39._8_4_ * fStack_3690;
          fStack_351c = auVar39._12_4_ * fStack_368c;
          local_3508 = vpbroadcastd_avx512vl();
          local_3518 = vpbroadcastd_avx512vl();
          local_3568 = local_36c8._0_8_;
          uStack_3560 = local_36c8._8_8_;
          local_3558 = local_36d8._0_8_;
          uStack_3550 = local_36d8._8_8_;
          local_3548 = local_36e8;
          vpcmpeqd_avx2(ZEXT1632(local_3538),ZEXT1632(local_3538));
          uStack_34f4 = context->user->instID[0];
          local_34f8 = uStack_34f4;
          uStack_34f0 = uStack_34f4;
          uStack_34ec = uStack_34f4;
          uStack_34e8 = context->user->instPrimID[0];
          uStack_34e4 = uStack_34e8;
          uStack_34e0 = uStack_34e8;
          uStack_34dc = uStack_34e8;
          local_3728 = *(int *)(ray_00 + 0x80);
          iStack_3724 = *(int *)(ray_00 + 0x84);
          iStack_3720 = *(int *)(ray_00 + 0x88);
          iStack_371c = *(int *)(ray_00 + 0x8c);
          auVar39 = vmulps_avx512vl(auVar39,local_36a8);
          bVar29 = (bool)(bVar20 >> 1 & 1);
          bVar8 = (bool)(bVar20 >> 2 & 1);
          *(uint *)(ray_00 + 0x80) =
               (uint)(bVar20 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar20 & 1) * local_3728;
          *(uint *)(ray_00 + 0x84) = (uint)bVar29 * auVar39._4_4_ | (uint)!bVar29 * iStack_3724;
          *(uint *)(ray_00 + 0x88) = (uint)bVar8 * auVar39._8_4_ | (uint)!bVar8 * iStack_3720;
          *(uint *)(ray_00 + 0x8c) =
               (uint)(bVar20 >> 3) * auVar39._12_4_ | (uint)!(bool)(bVar20 >> 3) * iStack_371c;
          local_3748 = vpmovm2d_avx512vl((ulong)bVar20);
          args.valid = (int *)local_3748;
          args.geometryUserPtr = pGVar6->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_3568;
          args.N = 4;
          args.ray = (RTCRayN *)ray_00;
          if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_3738 = ray_00;
            (*pGVar6->occlusionFilterN)(&args);
            auVar34 = vxorps_avx512vl(auVar34,auVar34);
            auVar75 = ZEXT1664(auVar34);
            auVar34 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar74 = ZEXT1664(auVar34);
            auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar73 = ZEXT1664(auVar34);
            auVar34 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar72 = ZEXT1664(auVar34);
            auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar71 = ZEXT1664(auVar34);
            auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar70 = ZEXT1664(auVar34);
            ray_00 = local_3738;
          }
          auVar34 = auVar75._0_16_;
          uVar30 = vptestmd_avx512vl(local_3748,local_3748);
          uVar30 = uVar30 & 0xf;
          if ((char)uVar30 != '\0') {
            p_Var7 = context->args->filter;
            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var7)(&args);
              auVar34 = vxorps_avx512vl(auVar34,auVar34);
              auVar75 = ZEXT1664(auVar34);
              auVar34 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar74 = ZEXT1664(auVar34);
              auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar73 = ZEXT1664(auVar34);
              auVar34 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar72 = ZEXT1664(auVar34);
              auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar71 = ZEXT1664(auVar34);
              auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar70 = ZEXT1664(auVar34);
            }
            uVar30 = vptestmd_avx512vl(local_3748,local_3748);
            uVar30 = uVar30 & 0xf;
            auVar34 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar29 = (bool)((byte)uVar30 & 1);
            auVar46._0_4_ = (uint)bVar29 * auVar34._0_4_ | (uint)!bVar29 * *(int *)(args.ray + 0x80)
            ;
            bVar29 = (bool)((byte)(uVar30 >> 1) & 1);
            auVar46._4_4_ = (uint)bVar29 * auVar34._4_4_ | (uint)!bVar29 * *(int *)(args.ray + 0x84)
            ;
            bVar29 = (bool)((byte)(uVar30 >> 2) & 1);
            auVar46._8_4_ = (uint)bVar29 * auVar34._8_4_ | (uint)!bVar29 * *(int *)(args.ray + 0x88)
            ;
            bVar29 = SUB81(uVar30 >> 3,0);
            auVar46._12_4_ =
                 (uint)bVar29 * auVar34._12_4_ | (uint)!bVar29 * *(int *)(args.ray + 0x8c);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar46;
          }
          bVar29 = (bool)((byte)uVar30 & 1);
          auVar47._0_4_ = (uint)bVar29 * *(int *)pRVar1 | (uint)!bVar29 * local_3728;
          bVar29 = (bool)((byte)(uVar30 >> 1) & 1);
          auVar47._4_4_ = (uint)bVar29 * *(int *)(ray + 0x84) | (uint)!bVar29 * iStack_3724;
          bVar29 = (bool)((byte)(uVar30 >> 2) & 1);
          auVar47._8_4_ = (uint)bVar29 * *(int *)(ray + 0x88) | (uint)!bVar29 * iStack_3720;
          bVar29 = SUB81(uVar30 >> 3,0);
          auVar47._12_4_ = (uint)bVar29 * *(int *)(ray + 0x8c) | (uint)!bVar29 * iStack_371c;
          *(undefined1 (*) [16])pRVar1 = auVar47;
        }
        bVar21 = ((byte)uVar30 ^ 0xf) & bVar21;
      }
      if ((bVar21 == 0) || (bVar29 = 2 < uVar33, uVar33 = uVar33 + 1, bVar29)) break;
    }
    bVar18 = bVar18 & bVar21;
    if (bVar18 == 0) break;
  }
  bVar18 = bVar18 ^ 0xf;
LAB_00810117:
  bVar28 = bVar28 | bVar18;
  if (bVar28 == 0xf) {
LAB_00810120:
    iVar19 = 3;
  }
  else {
    auVar34 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    tray.tfar.field_0.i[0] =
         (uint)(bVar28 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar28 & 1) * tray.tfar.field_0.i[0];
    bVar29 = (bool)(bVar28 >> 1 & 1);
    tray.tfar.field_0.i[1] = (uint)bVar29 * auVar34._4_4_ | (uint)!bVar29 * tray.tfar.field_0.i[1];
    bVar29 = (bool)(bVar28 >> 2 & 1);
    tray.tfar.field_0.i[2] = (uint)bVar29 * auVar34._8_4_ | (uint)!bVar29 * tray.tfar.field_0.i[2];
    bVar29 = (bool)(bVar28 >> 3 & 1);
    tray.tfar.field_0.i[3] = (uint)bVar29 * auVar34._12_4_ | (uint)!bVar29 * tray.tfar.field_0.i[3];
    iVar19 = 0;
  }
LAB_00810148:
  if (iVar19 == 3) {
    bVar28 = bVar28 & bVar31;
    bVar29 = (bool)(bVar28 >> 1 & 1);
    bVar8 = (bool)(bVar28 >> 2 & 1);
    *(uint *)pRVar1 =
         (uint)(bVar28 & 1) * auVar72._0_4_ | (uint)!(bool)(bVar28 & 1) * *(int *)pRVar1;
    *(uint *)(ray + 0x84) = (uint)bVar29 * auVar72._4_4_ | (uint)!bVar29 * *(int *)(ray + 0x84);
    *(uint *)(ray + 0x88) = (uint)bVar8 * auVar72._8_4_ | (uint)!bVar8 * *(int *)(ray + 0x88);
    *(uint *)(ray + 0x8c) =
         (uint)(bVar28 >> 3) * auVar72._12_4_ | (uint)!(bool)(bVar28 >> 3) * *(int *)(ray + 0x8c);
    return;
  }
  goto LAB_0080f9ae;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }